

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall CLI::App::get_subcommand(App *this,App *subcom)

{
  bool bVar1;
  OptionNotFound *pOVar2;
  element_type *peVar3;
  string *psVar4;
  string local_90;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *local_70;
  App_p *subcomptr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2;
  allocator local_39;
  string local_38;
  App *local_18;
  App *subcom_local;
  App *this_local;
  
  local_18 = subcom;
  subcom_local = this;
  if (subcom == (App *)0x0) {
    pOVar2 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"nullptr passed",&local_39);
    OptionNotFound::OptionNotFound(pOVar2,&local_38);
    __cxa_throw(pOVar2,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
  }
  __end2 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
           begin(&this->subcommands_);
  subcomptr = (App_p *)std::
                       vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                       ::end(&this->subcommands_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                *)&subcomptr);
    if (!bVar1) {
      pOVar2 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      psVar4 = get_name_abi_cxx11_(local_18);
      ::std::__cxx11::string::string((string *)&local_90,(string *)psVar4);
      OptionNotFound::OptionNotFound(pOVar2,&local_90);
      __cxa_throw(pOVar2,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
    }
    local_70 = &__gnu_cxx::
                __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                ::operator*(&__end2)->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
    peVar3 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(local_70);
    if (peVar3 == local_18) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end2);
  }
  peVar3 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(local_70);
  return peVar3;
}

Assistant:

App *get_subcommand(const App *subcom) const {
        if(subcom == nullptr)
            throw OptionNotFound("nullptr passed");
        for(const App_p &subcomptr : subcommands_)
            if(subcomptr.get() == subcom)
                return subcomptr.get();
        throw OptionNotFound(subcom->get_name());
    }